

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

int __thiscall
QEvdevTouchScreenData::findClosestContact
          (QEvdevTouchScreenData *this,QHash<int,_QEvdevTouchScreenData::Contact> *contacts,int x,
          int y,int *dist)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  Data *pDVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  
  pDVar7 = contacts->d;
  if (pDVar7 == (Data *)0x0) {
    pDVar7 = (Data *)0x0;
    uVar8 = 0;
LAB_0010c416:
    iVar5 = -1;
    iVar9 = -1;
    if (pDVar7 == (Data *)0x0 && uVar8 == 0) goto LAB_0010c4ea;
  }
  else {
    if (pDVar7->spans->offsets[0] == 0xff) {
      uVar4 = 1;
      do {
        uVar8 = uVar4;
        if (pDVar7->numBuckets == uVar8) {
          pDVar7 = (Data *)0x0;
          uVar8 = 0;
          break;
        }
        uVar4 = uVar8 + 1;
      } while (pDVar7->spans[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f] == 0xff);
      goto LAB_0010c416;
    }
    uVar8 = 0;
  }
  iVar9 = -1;
  iVar5 = -1;
  do {
    pSVar2 = pDVar7->spans;
    pEVar3 = pSVar2[uVar8 >> 7].entries;
    bVar1 = pSVar2[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f];
    iVar10 = x - *(int *)(pEVar3[bVar1].storage.data + 8);
    iVar6 = y - *(int *)(pEVar3[bVar1].storage.data + 0xc);
    iVar6 = iVar6 * iVar6 + iVar10 * iVar10;
    if (iVar6 < iVar9 || iVar9 == -1) {
      iVar5 = *(int *)(pEVar3[bVar1].storage.data + 4);
      iVar9 = iVar6;
    }
    do {
      if (pDVar7->numBuckets - 1 == uVar8) {
        pDVar7 = (Data *)0x0;
        uVar8 = 0;
        break;
      }
      uVar8 = uVar8 + 1;
    } while (pSVar2[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f] == 0xff);
  } while ((pDVar7 != (Data *)0x0) || (uVar8 != 0));
LAB_0010c4ea:
  if (dist != (int *)0x0) {
    *dist = iVar9;
  }
  return iVar5;
}

Assistant:

inline const_iterator constBegin() const noexcept { return d ? const_iterator(d->begin()): const_iterator(); }